

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

ssize_t __thiscall memory_io_buf::read_file(memory_io_buf *this,int f,void *buf,size_t nbytes)

{
  size_t sVar1;
  ulong __n;
  pointer __src;
  
  sVar1 = this->readOffset;
  __src = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start + sVar1;
  __n = (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (nbytes < __n) {
    __n = nbytes;
  }
  if (__n != 0) {
    memmove(buf,__src,__n);
    sVar1 = this->readOffset;
  }
  this->readOffset = sVar1 + __n;
  return __n;
}

Assistant:

virtual ssize_t read_file(int f, void* buf, size_t nbytes) {
        nbytes = min(nbytes, data.size()-readOffset);
        copy(data.data()+readOffset, data.data()+readOffset+nbytes, reinterpret_cast<char *>(buf));
        readOffset += nbytes;
        return nbytes;
    }